

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-detection.c
# Opt level: O0

int coda_evaluate_detection_node
              (coda_detection_node *node,coda_cursor_conflict *cursor,
              coda_product_definition **definition)

{
  int iVar1;
  long *in_FS_OFFSET;
  int local_340;
  int local_33c;
  int result;
  int i;
  coda_cursor_conflict subcursor;
  coda_product_definition **definition_local;
  coda_cursor_conflict *cursor_local;
  coda_detection_node *node_local;
  
  subcursor.stack[0x1f].bit_offset = (int64_t)definition;
  memcpy(&result,cursor,0x310);
  *(undefined8 *)subcursor.stack[0x1f].bit_offset = 0;
  if (node == (coda_detection_node *)0x0) {
    return 0;
  }
  if (node->path == (char *)0x0) {
    if (node->expression != (coda_expression *)0x0) {
      iVar1 = coda_expression_eval_bool(node->expression,(coda_cursor_conflict *)&result,&local_340)
      ;
      if (iVar1 != 0) {
        *(undefined4 *)(*in_FS_OFFSET + -0x11f0) = 0;
        return 0;
      }
      if (local_340 == 0) {
        return 0;
      }
    }
  }
  else {
    iVar1 = coda_cursor_goto((coda_cursor_conflict *)&result,node->path);
    if (iVar1 != 0) {
      *(undefined4 *)(*in_FS_OFFSET + -0x11f0) = 0;
      return 0;
    }
  }
  local_33c = 0;
  while( true ) {
    if (node->num_subnodes <= local_33c) {
      if (node->rule != (coda_detection_rule *)0x0) {
        *(coda_product_definition_struct **)subcursor.stack[0x1f].bit_offset =
             node->rule->product_definition;
      }
      return 0;
    }
    iVar1 = coda_evaluate_detection_node
                      (node->subnode[local_33c],(coda_cursor_conflict *)&result,
                       (coda_product_definition **)subcursor.stack[0x1f].bit_offset);
    if (iVar1 != 0) break;
    if (*(long *)subcursor.stack[0x1f].bit_offset != 0) {
      return 0;
    }
    local_33c = local_33c + 1;
  }
  return -1;
}

Assistant:

int coda_evaluate_detection_node(coda_detection_node *node, coda_cursor *cursor, coda_product_definition **definition)
{
    coda_cursor subcursor = *cursor;
    int i;

    *definition = NULL;
    if (node == NULL)
    {
        return 0;
    }
    if (node->path != NULL)
    {
        if (coda_cursor_goto(&subcursor, node->path) != 0)
        {
            /* treat failures as 'does not exist' */
            coda_errno = 0;
            return 0;
        }
    }
    else if (node->expression != NULL)
    {
        int result;

        if (coda_expression_eval_bool(node->expression, &subcursor, &result) != 0)
        {
            /* treat failures as 'mismatches' */
            coda_errno = 0;
            return 0;
        }
        if (result == 0)
        {
            return 0;
        }
    }

    for (i = 0; i < node->num_subnodes; i++)
    {
        if (coda_evaluate_detection_node(node->subnode[i], &subcursor, definition) != 0)
        {
            return -1;
        }
        if (*definition != NULL)
        {
            return 0;
        }
    }

    if (node->rule != NULL)
    {
        *definition = node->rule->product_definition;
    }

    return 0;
}